

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O0

void __thiscall TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh(TPZMultiphysicsCompMesh *this)

{
  TPZSavable *in_RDI;
  TPZManVector<TPZCompMesh_*,_7> *unaff_retaddr;
  void **in_stack_00000068;
  TPZCompMesh *in_stack_00000070;
  int64_t in_stack_ffffffffffffffe8;
  TPZManVector<TPZCompMesh_*,_7> *in_stack_fffffffffffffff0;
  TPZSavable *newsize;
  
  newsize = in_RDI;
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_024e7900);
  TPZCompMesh::TPZCompMesh(in_stack_00000070,in_stack_00000068);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZMultiphysicsCompMesh_024e77d0;
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZMultiphysicsCompMesh_024e77d0;
  TPZManVector<int,_5>::TPZManVector
            ((TPZManVector<int,_5> *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  TPZManVector<TPZCompMesh_*,_7>::TPZManVector(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  TPZManVector<int,_5>::Resize((TPZManVector<int,_5> *)unaff_retaddr,(int64_t)newsize);
  TPZManVector<TPZCompMesh_*,_7>::Resize(unaff_retaddr,(int64_t)newsize);
  return;
}

Assistant:

TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh() : TPZCompMesh(){
    
    m_active_approx_spaces.Resize(0);
    m_mesh_vector.Resize(0);
}